

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_3ee9::test_iterator_move_equalorlarger(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *r;
  roaring64_iterator_t *it;
  uint64_t uVar2;
  
  r = roaring64_bitmap_create();
  it = roaring64_iterator_create(r);
  _Var1 = roaring64_iterator_move_equalorlarger(it,0);
  _assert_true((ulong)!_Var1,"roaring64_iterator_move_equalorlarger(it, 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x724);
  _Var1 = roaring64_iterator_move_equalorlarger(it,0xffffffffffffffff);
  _assert_true((ulong)!_Var1,"roaring64_iterator_move_equalorlarger(it, UINT64_MAX)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x725);
  roaring64_bitmap_add(r,0);
  roaring64_bitmap_add(r,0x800000000);
  roaring64_bitmap_add(r,0x800000001);
  roaring64_bitmap_add(r,0x800000002);
  roaring64_bitmap_add(r,0x1000000000);
  roaring64_iterator_reinit(r,it);
  _Var1 = roaring64_iterator_move_equalorlarger(it,0);
  _assert_true((ulong)_Var1,"roaring64_iterator_move_equalorlarger(it, 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x72e);
  _Var1 = roaring64_iterator_has_value(it);
  _assert_true((ulong)_Var1,"roaring64_iterator_has_value(it)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x72f);
  uVar2 = roaring64_iterator_value(it);
  _assert_int_equal(uVar2,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x730);
  _Var1 = roaring64_iterator_move_equalorlarger(it,0);
  _assert_true((ulong)_Var1,"roaring64_iterator_move_equalorlarger(it, 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x732);
  _Var1 = roaring64_iterator_has_value(it);
  _assert_true((ulong)_Var1,"roaring64_iterator_has_value(it)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x733);
  uVar2 = roaring64_iterator_value(it);
  _assert_int_equal(uVar2,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x734);
  _Var1 = roaring64_iterator_move_equalorlarger(it,1);
  _assert_true((ulong)_Var1,"roaring64_iterator_move_equalorlarger(it, 1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x736);
  _Var1 = roaring64_iterator_has_value(it);
  _assert_true((ulong)_Var1,"roaring64_iterator_has_value(it)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x737);
  uVar2 = roaring64_iterator_value(it);
  _assert_int_equal(uVar2,0x800000000,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x738);
  roaring64_iterator_reinit(r,it);
  _Var1 = roaring64_iterator_move_equalorlarger(it,0x800000002);
  _assert_true((ulong)_Var1,"roaring64_iterator_move_equalorlarger(it, (1ULL << 35) + 2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x73c);
  _Var1 = roaring64_iterator_has_value(it);
  _assert_true((ulong)_Var1,"roaring64_iterator_has_value(it)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x73d);
  uVar2 = roaring64_iterator_value(it);
  _assert_int_equal(uVar2,0x800000002,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x73e);
  _Var1 = roaring64_iterator_move_equalorlarger(it,0x800000003);
  _assert_true((ulong)_Var1,"roaring64_iterator_move_equalorlarger(it, (1ULL << 35) + 3)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x740);
  _Var1 = roaring64_iterator_has_value(it);
  _assert_true((ulong)_Var1,"roaring64_iterator_has_value(it)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x741);
  uVar2 = roaring64_iterator_value(it);
  _assert_int_equal(uVar2,0x1000000000,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x742);
  _Var1 = roaring64_iterator_move_equalorlarger(it,0x1000000001);
  _assert_true((ulong)!_Var1,"roaring64_iterator_move_equalorlarger(it, (1ULL << 36) + 1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x744);
  _Var1 = roaring64_iterator_has_value(it);
  _assert_true((ulong)!_Var1,"roaring64_iterator_has_value(it)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x745);
  _Var1 = roaring64_iterator_previous(it);
  _assert_true((ulong)_Var1,"roaring64_iterator_previous(it)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x748);
  uVar2 = roaring64_iterator_value(it);
  _assert_int_equal(uVar2,0x1000000000,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x749);
  _Var1 = roaring64_iterator_advance(it);
  _assert_true((ulong)!_Var1,"roaring64_iterator_advance(it)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x74c);
  _Var1 = roaring64_iterator_move_equalorlarger(it,0x1000000000);
  _assert_true((ulong)_Var1,"roaring64_iterator_move_equalorlarger(it, (1ULL << 36))",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x74d);
  _Var1 = roaring64_iterator_has_value(it);
  _assert_true((ulong)_Var1,"roaring64_iterator_has_value(it)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x74e);
  uVar2 = roaring64_iterator_value(it);
  _assert_int_equal(uVar2,0x1000000000,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x74f);
  _Var1 = roaring64_iterator_move_equalorlarger(it,0x7ffffffff);
  _assert_true((ulong)_Var1,"roaring64_iterator_move_equalorlarger(it, (1ULL << 35) - 1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x752);
  _Var1 = roaring64_iterator_has_value(it);
  _assert_true((ulong)_Var1,"roaring64_iterator_has_value(it)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x753);
  uVar2 = roaring64_iterator_value(it);
  _assert_int_equal(uVar2,0x800000000,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x754);
  _Var1 = roaring64_iterator_previous(it);
  _assert_true((ulong)_Var1,"roaring64_iterator_previous(it)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x757);
  _Var1 = roaring64_iterator_previous(it);
  _assert_true((ulong)!_Var1,"roaring64_iterator_previous(it)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x758);
  _Var1 = roaring64_iterator_move_equalorlarger(it,0);
  _assert_true((ulong)_Var1,"roaring64_iterator_move_equalorlarger(it, 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x759);
  _Var1 = roaring64_iterator_has_value(it);
  _assert_true((ulong)_Var1,"roaring64_iterator_has_value(it)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x75a);
  uVar2 = roaring64_iterator_value(it);
  _assert_int_equal(uVar2,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x75b);
  roaring64_iterator_free(it);
  roaring64_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_iterator_move_equalorlarger) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();

    roaring64_iterator_t* it = roaring64_iterator_create(r);
    assert_false(roaring64_iterator_move_equalorlarger(it, 0));
    assert_false(roaring64_iterator_move_equalorlarger(it, UINT64_MAX));

    roaring64_bitmap_add(r, 0);
    roaring64_bitmap_add(r, 1ULL << 35);
    roaring64_bitmap_add(r, (1ULL << 35) + 1);
    roaring64_bitmap_add(r, (1ULL << 35) + 2);
    roaring64_bitmap_add(r, (1ULL << 36));

    roaring64_iterator_reinit(r, it);
    assert_true(roaring64_iterator_move_equalorlarger(it, 0));
    assert_true(roaring64_iterator_has_value(it));
    assert_int_equal(roaring64_iterator_value(it), 0);

    assert_true(roaring64_iterator_move_equalorlarger(it, 0));
    assert_true(roaring64_iterator_has_value(it));
    assert_int_equal(roaring64_iterator_value(it), 0);

    assert_true(roaring64_iterator_move_equalorlarger(it, 1));
    assert_true(roaring64_iterator_has_value(it));
    assert_int_equal(roaring64_iterator_value(it), (1ULL << 35));

    roaring64_iterator_reinit(r, it);

    assert_true(roaring64_iterator_move_equalorlarger(it, (1ULL << 35) + 2));
    assert_true(roaring64_iterator_has_value(it));
    assert_int_equal(roaring64_iterator_value(it), ((1ULL << 35) + 2));

    assert_true(roaring64_iterator_move_equalorlarger(it, (1ULL << 35) + 3));
    assert_true(roaring64_iterator_has_value(it));
    assert_int_equal(roaring64_iterator_value(it), (1ULL << 36));

    assert_false(roaring64_iterator_move_equalorlarger(it, (1ULL << 36) + 1));
    assert_false(roaring64_iterator_has_value(it));

    // Check that we can move backward from after the last entry.
    assert_true(roaring64_iterator_previous(it));
    assert_int_equal(roaring64_iterator_value(it), (1ULL << 36));

    // Check that we can move even after the last entry.
    assert_false(roaring64_iterator_advance(it));
    assert_true(roaring64_iterator_move_equalorlarger(it, (1ULL << 36)));
    assert_true(roaring64_iterator_has_value(it));
    assert_int_equal(roaring64_iterator_value(it), (1ULL << 36));

    // Check that we can move backward using move_equalorlarger.
    assert_true(roaring64_iterator_move_equalorlarger(it, (1ULL << 35) - 1));
    assert_true(roaring64_iterator_has_value(it));
    assert_int_equal(roaring64_iterator_value(it), (1ULL << 35));

    // Check that we can move even before the first entry.
    assert_true(roaring64_iterator_previous(it));
    assert_false(roaring64_iterator_previous(it));
    assert_true(roaring64_iterator_move_equalorlarger(it, 0));
    assert_true(roaring64_iterator_has_value(it));
    assert_int_equal(roaring64_iterator_value(it), 0);

    roaring64_iterator_free(it);
    roaring64_bitmap_free(r);
}